

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::SubmitKeyRecord(DnsStats *this,uint8_t *content,uint32_t length)

{
  byte bVar1;
  uint number;
  uint32_t well_known_prime;
  uint32_t prime_length;
  uint32_t algorithm;
  uint32_t length_local;
  uint8_t *content_local;
  DnsStats *this_local;
  
  if ((((8 < length) && (bVar1 = content[3], SubmitRegistryNumber(this,0xd,(uint)bVar1), bVar1 == 2)
       ) && (number = (uint)CONCAT11(content[4],content[5]), number < 0x10)) &&
     ((SubmitRegistryNumber(this,0xe,number), number == 1 || (number == 2)))) {
    SubmitRegistryNumber(this,0x11,(uint)CONCAT11(content[6],content[7]));
  }
  return;
}

Assistant:

void DnsStats::SubmitKeyRecord(uint8_t * content, uint32_t length)
{
    if (length > 8)
    {
        uint32_t algorithm = content[3];
        SubmitRegistryNumber(REGISTRY_DNSSEC_Algorithm_Numbers, algorithm);

        if (algorithm == 2)
        {
            uint32_t prime_length = (content[4] << 8) | content[5];
            if (prime_length < 16)
            {
                SubmitRegistryNumber(REGISTRY_DNSSEC_KEY_Prime_Lengths, prime_length);

                if (prime_length == 1 || prime_length == 2)
                {
                    uint32_t well_known_prime = (content[6] << 8) | content[7];
                    SubmitRegistryNumber(REGISTRY_DNSSEC_KEY_Well_Known_Primes, well_known_prime);
                }
            }
        }
    }
}